

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

bool __thiscall
cmComputeLinkInformation::CheckImplicitDirItem(cmComputeLinkInformation *this,string *item)

{
  bool bVar1;
  PolicyStatus PVar2;
  iterator iVar3;
  string file;
  string dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  if (this->LinkTypeEnabled == true) {
    cmsys::SystemTools::GetFilenamePath(&local_40,item);
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->ImplicitLinkDirs)._M_t,&local_40);
    if ((_Rb_tree_header *)iVar3._M_node ==
        &(this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header) {
      bVar1 = false;
    }
    else {
      cmsys::SystemTools::GetFilenameName(&local_60,item);
      bVar1 = cmsys::RegularExpression::find(&this->ExtractAnyLibraryName,local_60._M_dataplus._M_p)
      ;
      if ((bVar1) &&
         (PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0060(this->Target), 2 < PVar2 - NEW)) {
        if ((PVar2 == WARN) && (this->CMP0060Warn == true)) {
          std::operator+(&local_80,"CMP0060-WARNING-GIVEN-",item);
          bVar1 = cmake::GetPropertyAsBool(this->CMakeInstance,&local_80);
          if (!bVar1) {
            cmake::SetProperty(this->CMakeInstance,&local_80,"1");
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&this->CMP0060WarnItems,item);
          }
          std::__cxx11::string::~string((string *)&local_80);
        }
        AddUserItem(this,&local_60,false);
        bVar1 = true;
        cmOrderDirectories::AddLinkLibrary(this->OrderLinkerSearchPath,item);
      }
      else {
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)&local_60);
    }
    std::__cxx11::string::~string((string *)&local_40);
    return bVar1;
  }
  return false;
}

Assistant:

bool cmComputeLinkInformation::CheckImplicitDirItem(std::string const& item)
{
  // We only switch to a pathless item if the link type may be
  // enforced.  Fortunately only platforms that support link types
  // seem to have magic per-architecture implicit link directories.
  if (!this->LinkTypeEnabled) {
    return false;
  }

  // Check if this item is in an implicit link directory.
  std::string dir = cmSystemTools::GetFilenamePath(item);
  if (this->ImplicitLinkDirs.find(dir) == this->ImplicitLinkDirs.end()) {
    // Only libraries in implicit link directories are converted to
    // pathless items.
    return false;
  }

  // Only apply the policy below if the library file is one that can
  // be found by the linker.
  std::string file = cmSystemTools::GetFilenameName(item);
  if (!this->ExtractAnyLibraryName.find(file)) {
    return false;
  }

  // Check the policy for whether we should use the approach below.
  switch (this->Target->GetPolicyStatusCMP0060()) {
    case cmPolicies::WARN:
      if (this->CMP0060Warn) {
        // Print the warning at most once for this item.
        std::string const& wid = "CMP0060-WARNING-GIVEN-" + item;
        if (!this->CMakeInstance->GetPropertyAsBool(wid)) {
          this->CMakeInstance->SetProperty(wid, "1");
          this->CMP0060WarnItems.insert(item);
        }
      }
    case cmPolicies::OLD:
      break;
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::NEW:
      return false;
  }

  // Many system linkers support multiple architectures by
  // automatically selecting the implicit linker search path for the
  // current architecture.  If the library appears in an implicit link
  // directory then just report the file name without the directory
  // portion.  This will allow the system linker to locate the proper
  // library for the architecture at link time.
  this->AddUserItem(file, false);

  // Make sure the link directory ordering will find the library.
  this->OrderLinkerSearchPath->AddLinkLibrary(item);

  return true;
}